

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecRe.c
# Opt level: O3

Vec_Bit_t * Ree_CollectInsiders(Gia_Man_t *pGia,Vec_Int_t *vAdds)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Vec_Bit_t *vVisited;
  int *piVar4;
  Vec_Bit_t *vInsiders;
  int *piVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  size_t sVar9;
  
  iVar7 = ((pGia->nObjs >> 5) + 1) - (uint)((pGia->nObjs & 0x1fU) == 0);
  vVisited = (Vec_Bit_t *)malloc(0x10);
  iVar6 = iVar7 * 0x20;
  vVisited->nCap = iVar6;
  if (iVar7 == 0) {
    sVar9 = 0;
    piVar4 = (int *)0x0;
  }
  else {
    sVar9 = (long)iVar7 * 4;
    piVar4 = (int *)malloc(sVar9);
  }
  vVisited->pArray = piVar4;
  vVisited->nSize = iVar6;
  memset(piVar4,0,sVar9);
  vInsiders = (Vec_Bit_t *)malloc(0x10);
  vInsiders->nCap = iVar6;
  if (iVar7 == 0) {
    piVar5 = (int *)0x0;
    sVar9 = 0;
  }
  else {
    sVar9 = (long)iVar7 << 2;
    piVar5 = (int *)malloc(sVar9);
  }
  vInsiders->pArray = piVar5;
  vInsiders->nSize = iVar6;
  uVar8 = 0;
  memset(piVar5,0,sVar9);
  iVar6 = vAdds->nSize;
  if (0 < iVar6) {
    do {
      if (iVar6 <= (int)(uVar8 + 2)) {
LAB_00670fe6:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar4 = vAdds->pArray;
      uVar1 = piVar4[uVar8 + 2];
      if (uVar1 != 0) {
        uVar2 = piVar4[uVar8];
        if (((int)uVar2 < 0) || (vVisited->nSize <= (int)uVar2)) {
LAB_00670fc7:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecBit.h"
                        ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
        }
        uVar3 = piVar4[uVar8 + 1];
        piVar5 = vVisited->pArray;
        piVar5[uVar2 >> 5] = piVar5[uVar2 >> 5] | 1 << ((byte)uVar2 & 0x1f);
        if (((int)uVar3 < 0) ||
           (((vVisited->nSize <= (int)uVar3 ||
             (piVar5[uVar3 >> 5] = piVar5[uVar3 >> 5] | 1 << ((byte)uVar3 & 0x1f), (int)uVar1 < 0))
            || (vVisited->nSize <= (int)uVar1)))) goto LAB_00670fc7;
        piVar5[uVar1 >> 5] = piVar5[uVar1 >> 5] | 1 << ((byte)uVar1 & 0x1f);
        if ((vAdds->nSize <= (int)(uVar8 + 3)) || ((uint)vAdds->nSize <= uVar8 + 4))
        goto LAB_00670fe6;
        iVar6 = piVar4[uVar8 + 4];
        Ree_CollectInsiders_rec(pGia,piVar4[uVar8 + 3],vVisited,vInsiders);
        Ree_CollectInsiders_rec(pGia,iVar6,vVisited,vInsiders);
        iVar6 = vAdds->nSize;
      }
      uVar8 = uVar8 + 6;
    } while ((int)uVar8 < iVar6);
    piVar4 = vVisited->pArray;
  }
  if (piVar4 != (int *)0x0) {
    free(piVar4);
  }
  free(vVisited);
  return vInsiders;
}

Assistant:

Vec_Bit_t * Ree_CollectInsiders( Gia_Man_t * pGia, Vec_Int_t * vAdds )
{
    Vec_Bit_t * vVisited = Vec_BitStart( Gia_ManObjNum(pGia) );
    Vec_Bit_t * vInsiders = Vec_BitStart( Gia_ManObjNum(pGia) );
    int i, Entry1, Entry2, Entry3;
    for ( i = 0; 6*i < Vec_IntSize(vAdds); i++ )
    {
        if ( Vec_IntEntry(vAdds, 6*i+2) == 0 ) // HADD
            continue;
        // mark inputs
        Entry1 = Vec_IntEntry( vAdds, 6*i + 0 );
        Entry2 = Vec_IntEntry( vAdds, 6*i + 1 );
        Entry3 = Vec_IntEntry( vAdds, 6*i + 2 );
        Vec_BitWriteEntry( vVisited, Entry1, 1 );
        Vec_BitWriteEntry( vVisited, Entry2, 1 );
        Vec_BitWriteEntry( vVisited, Entry3, 1 );
        // traverse from outputs
        Entry1 = Vec_IntEntry( vAdds, 6*i + 3 );
        Entry2 = Vec_IntEntry( vAdds, 6*i + 4 );
        Ree_CollectInsiders_rec( pGia, Entry1, vVisited, vInsiders );
        Ree_CollectInsiders_rec( pGia, Entry2, vVisited, vInsiders );
    }
    Vec_BitFree( vVisited );
    return vInsiders;
}